

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O0

void find_parameter_C(problem *prob,parameter *param,int nr_fold,double start_C,double max_C,
                     double *best_C,double *best_rate)

{
  int iVar1;
  int iVar2;
  _func_void_char_ptr *print_func;
  int iVar3;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  void *__ptr_02;
  void *__ptr_03;
  void *pvVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double current_rate;
  double dStack_148;
  int total_correct;
  double norm_w_diff;
  model *pmStack_138;
  int total_w_size;
  model *submodel;
  parameter param_t;
  int end_1;
  int begin_1;
  int j_2;
  int k;
  int j_1;
  int end;
  int begin;
  int j;
  _func_void_char_ptr *default_print_string;
  parameter param1;
  int num_unchanged_w;
  double **prev_w;
  double ratio;
  problem *subprob;
  double *target;
  int *perm;
  int l;
  int *fold_start;
  int i;
  double *best_rate_local;
  double *best_C_local;
  double max_C_local;
  double start_C_local;
  int nr_fold_local;
  parameter *param_local;
  problem *prob_local;
  
  iVar1 = prob->l;
  __ptr = malloc((long)iVar1 << 2);
  __ptr_00 = malloc((long)prob->l << 3);
  __ptr_01 = malloc((long)nr_fold << 5);
  __ptr_02 = malloc((long)nr_fold << 3);
  for (fold_start._4_4_ = 0; fold_start._4_4_ < nr_fold; fold_start._4_4_ = fold_start._4_4_ + 1) {
    *(undefined8 *)((long)__ptr_02 + (long)fold_start._4_4_ * 8) = 0;
  }
  param1.init_sol._4_4_ = 0;
  memcpy(&default_print_string,param,0x40);
  print_func = liblinear_print_string;
  start_C_local._4_4_ = nr_fold;
  if (iVar1 < nr_fold) {
    fprintf(_stderr,
            "WARNING: # folds > # data. Will use # folds = # data instead (i.e., leave-one-out cross validation)\n"
           );
    start_C_local._4_4_ = iVar1;
  }
  __ptr_03 = malloc((long)(start_C_local._4_4_ + 1) << 2);
  for (fold_start._4_4_ = 0; fold_start._4_4_ < iVar1; fold_start._4_4_ = fold_start._4_4_ + 1) {
    *(int *)((long)__ptr + (long)fold_start._4_4_ * 4) = fold_start._4_4_;
  }
  for (fold_start._4_4_ = 0; fold_start._4_4_ < iVar1; fold_start._4_4_ = fold_start._4_4_ + 1) {
    iVar3 = rand();
    swap<int>((int *)((long)__ptr + (long)fold_start._4_4_ * 4),
              (int *)((long)__ptr +
                     (long)(fold_start._4_4_ + iVar3 % (iVar1 - fold_start._4_4_)) * 4));
  }
  for (fold_start._4_4_ = 0; fold_start._4_4_ <= start_C_local._4_4_;
      fold_start._4_4_ = fold_start._4_4_ + 1) {
    *(int *)((long)__ptr_03 + (long)fold_start._4_4_ * 4) =
         (fold_start._4_4_ * iVar1) / start_C_local._4_4_;
  }
  for (fold_start._4_4_ = 0; fold_start._4_4_ < start_C_local._4_4_;
      fold_start._4_4_ = fold_start._4_4_ + 1) {
    iVar3 = *(int *)((long)__ptr_03 + (long)fold_start._4_4_ * 4);
    iVar2 = *(int *)((long)__ptr_03 + (long)(fold_start._4_4_ + 1) * 4);
    *(double *)((long)__ptr_01 + (long)fold_start._4_4_ * 0x20 + 0x18) = prob->bias;
    *(int *)((long)__ptr_01 + (long)fold_start._4_4_ * 0x20 + 4) = prob->n;
    *(int *)((long)__ptr_01 + (long)fold_start._4_4_ * 0x20) = iVar1 - (iVar2 - iVar3);
    pvVar4 = malloc((long)*(int *)((long)__ptr_01 + (long)fold_start._4_4_ * 0x20) << 3);
    *(void **)((long)__ptr_01 + (long)fold_start._4_4_ * 0x20 + 0x10) = pvVar4;
    pvVar4 = malloc((long)*(int *)((long)__ptr_01 + (long)fold_start._4_4_ * 0x20) << 3);
    *(void **)((long)__ptr_01 + (long)fold_start._4_4_ * 0x20 + 8) = pvVar4;
    begin_1 = 0;
    for (j_2 = 0; j_2 < iVar3; j_2 = j_2 + 1) {
      *(feature_node **)
       (*(long *)((long)__ptr_01 + (long)fold_start._4_4_ * 0x20 + 0x10) + (long)begin_1 * 8) =
           prob->x[*(int *)((long)__ptr + (long)j_2 * 4)];
      *(double *)(*(long *)((long)__ptr_01 + (long)fold_start._4_4_ * 0x20 + 8) + (long)begin_1 * 8)
           = prob->y[*(int *)((long)__ptr + (long)j_2 * 4)];
      begin_1 = begin_1 + 1;
    }
    while (j_2 = iVar2, j_2 < iVar1) {
      *(feature_node **)
       (*(long *)((long)__ptr_01 + (long)fold_start._4_4_ * 0x20 + 0x10) + (long)begin_1 * 8) =
           prob->x[*(int *)((long)__ptr + (long)j_2 * 4)];
      *(double *)(*(long *)((long)__ptr_01 + (long)fold_start._4_4_ * 0x20 + 8) + (long)begin_1 * 8)
           = prob->y[*(int *)((long)__ptr + (long)j_2 * 4)];
      begin_1 = begin_1 + 1;
      iVar2 = j_2 + 1;
    }
  }
  *best_rate = 0.0;
  max_C_local = start_C;
  if (start_C <= 0.0) {
    max_C_local = calc_start_C(prob,param);
  }
  for (param1.eps = max_C_local; param1.eps <= max_C; param1.eps = param1.eps * 2.0) {
    set_print_string_function(print_null);
    for (fold_start._4_4_ = 0; fold_start._4_4_ < start_C_local._4_4_;
        fold_start._4_4_ = fold_start._4_4_ + 1) {
      param_t.init_sol._4_4_ = *(int *)((long)__ptr_03 + (long)fold_start._4_4_ * 4);
      param_t.init_sol._0_4_ = *(int *)((long)__ptr_03 + (long)(fold_start._4_4_ + 1) * 4);
      memcpy(&submodel,&default_print_string,0x40);
      param_t.p = *(double *)((long)__ptr_02 + (long)fold_start._4_4_ * 8);
      pmStack_138 = train((problem *)((long)__ptr_01 + (long)fold_start._4_4_ * 0x20),
                          (parameter *)&submodel);
      if (pmStack_138->nr_class == 2) {
        norm_w_diff._4_4_ = *(int *)((long)__ptr_01 + (long)fold_start._4_4_ * 0x20 + 4);
      }
      else {
        norm_w_diff._4_4_ =
             *(int *)((long)__ptr_01 + (long)fold_start._4_4_ * 0x20 + 4) * pmStack_138->nr_class;
      }
      if (*(long *)((long)__ptr_02 + (long)fold_start._4_4_ * 8) == 0) {
        pvVar4 = malloc((long)norm_w_diff._4_4_ << 3);
        *(void **)((long)__ptr_02 + (long)fold_start._4_4_ * 8) = pvVar4;
        for (end_1 = 0; end_1 < norm_w_diff._4_4_; end_1 = end_1 + 1) {
          *(double *)(*(long *)((long)__ptr_02 + (long)fold_start._4_4_ * 8) + (long)end_1 * 8) =
               pmStack_138->w[end_1];
        }
      }
      else if (param1.init_sol._4_4_ < 0) {
        for (end_1 = 0; end_1 < norm_w_diff._4_4_; end_1 = end_1 + 1) {
          *(double *)(*(long *)((long)__ptr_02 + (long)fold_start._4_4_ * 8) + (long)end_1 * 8) =
               pmStack_138->w[end_1];
        }
      }
      else {
        dStack_148 = 0.0;
        for (end_1 = 0; end_1 < norm_w_diff._4_4_; end_1 = end_1 + 1) {
          dStack_148 = (pmStack_138->w[end_1] -
                       *(double *)
                        (*(long *)((long)__ptr_02 + (long)fold_start._4_4_ * 8) + (long)end_1 * 8))
                       * (pmStack_138->w[end_1] -
                         *(double *)
                          (*(long *)((long)__ptr_02 + (long)fold_start._4_4_ * 8) + (long)end_1 * 8)
                         ) + dStack_148;
          *(double *)(*(long *)((long)__ptr_02 + (long)fold_start._4_4_ * 8) + (long)end_1 * 8) =
               pmStack_138->w[end_1];
        }
        dVar5 = sqrt(dStack_148);
        if (1e-15 < dVar5) {
          param1.init_sol._4_4_ = -1;
        }
      }
      for (end_1 = param_t.init_sol._4_4_; end_1 < (int)param_t.init_sol; end_1 = end_1 + 1) {
        dVar5 = predict(pmStack_138,prob->x[*(int *)((long)__ptr + (long)end_1 * 4)]);
        *(double *)((long)__ptr_00 + (long)*(int *)((long)__ptr + (long)end_1 * 4) * 8) = dVar5;
      }
      free_and_destroy_model(&stack0xfffffffffffffec8);
    }
    set_print_string_function(print_func);
    current_rate._4_4_ = 0;
    for (fold_start._4_4_ = 0; fold_start._4_4_ < prob->l; fold_start._4_4_ = fold_start._4_4_ + 1)
    {
      dVar5 = *(double *)((long)__ptr_00 + (long)fold_start._4_4_ * 8);
      if ((dVar5 == prob->y[fold_start._4_4_]) && (!NAN(dVar5) && !NAN(prob->y[fold_start._4_4_])))
      {
        current_rate._4_4_ = current_rate._4_4_ + 1;
      }
    }
    dVar5 = (double)current_rate._4_4_ / (double)prob->l;
    if (*best_rate <= dVar5 && dVar5 != *best_rate) {
      *best_C = param1.eps;
      *best_rate = dVar5;
    }
    dVar6 = log(param1.eps);
    dVar7 = log(2.0);
    info("log2c=%7.2f\trate=%g\n",dVar6 / dVar7,dVar5 * 100.0);
    param1.init_sol._4_4_ = param1.init_sol._4_4_ + 1;
    if (param1.init_sol._4_4_ == 3) break;
  }
  if ((max_C < param1.eps) && (max_C_local < max_C)) {
    info("warning: maximum C reached.\n");
  }
  free(__ptr_03);
  free(__ptr);
  free(__ptr_00);
  for (fold_start._4_4_ = 0; fold_start._4_4_ < start_C_local._4_4_;
      fold_start._4_4_ = fold_start._4_4_ + 1) {
    free(*(void **)((long)__ptr_01 + (long)fold_start._4_4_ * 0x20 + 0x10));
    free(*(void **)((long)__ptr_01 + (long)fold_start._4_4_ * 0x20 + 8));
    free(*(void **)((long)__ptr_02 + (long)fold_start._4_4_ * 8));
  }
  free(__ptr_02);
  free(__ptr_01);
  return;
}

Assistant:

void find_parameter_C(const problem *prob, const parameter *param, int nr_fold, double start_C, double max_C, double *best_C, double *best_rate)
{
	// variables for CV
	int i;
	int *fold_start;
	int l = prob->l;
	int *perm = Malloc(int, l);
	double *target = Malloc(double, prob->l);
	struct problem *subprob = Malloc(problem,nr_fold);

	// variables for warm start
	double ratio = 2;
	double **prev_w = Malloc(double*, nr_fold);
	for(i = 0; i < nr_fold; i++)
		prev_w[i] = NULL;
	int num_unchanged_w = 0;
	struct parameter param1 = *param;
	void (*default_print_string) (const char *) = liblinear_print_string;

	if (nr_fold > l)
	{
		nr_fold = l;
		fprintf(stderr,"WARNING: # folds > # data. Will use # folds = # data instead (i.e., leave-one-out cross validation)\n");
	}
	fold_start = Malloc(int,nr_fold+1);
	for(i=0;i<l;i++) perm[i]=i;
	for(i=0;i<l;i++)
	{
		int j = i+rand()%(l-i);
		swap(perm[i],perm[j]);
	}
	for(i=0;i<=nr_fold;i++)
		fold_start[i]=i*l/nr_fold;

	for(i=0;i<nr_fold;i++)
	{
		int begin = fold_start[i];
		int end = fold_start[i+1];
		int j,k;

		subprob[i].bias = prob->bias;
		subprob[i].n = prob->n;
		subprob[i].l = l-(end-begin);
		subprob[i].x = Malloc(struct feature_node*,subprob[i].l);
		subprob[i].y = Malloc(double,subprob[i].l);

		k=0;
		for(j=0;j<begin;j++)
		{
			subprob[i].x[k] = prob->x[perm[j]];
			subprob[i].y[k] = prob->y[perm[j]];
			++k;
		}
		for(j=end;j<l;j++)
		{
			subprob[i].x[k] = prob->x[perm[j]];
			subprob[i].y[k] = prob->y[perm[j]];
			++k;
		}

	}

	*best_rate = 0;
	if(start_C <= 0)
		start_C = calc_start_C(prob,param);
	param1.C = start_C;

	while(param1.C <= max_C)
	{
		//Output diabled for running CV at a particular C
		set_print_string_function(&print_null);

#ifdef CV_OMP
#pragma omp parallel for private(i) schedule(dynamic)
#endif
		for(i=0; i<nr_fold; i++)
		{
			int j;
			int begin = fold_start[i];
			int end = fold_start[i+1];

			struct parameter param_t = param1;
			param_t.init_sol = prev_w[i];
			struct model *submodel = train(&subprob[i],&param_t);

			int total_w_size;
			if(submodel->nr_class == 2)
				total_w_size = subprob[i].n;
			else
				total_w_size = subprob[i].n * submodel->nr_class;

			if(prev_w[i] == NULL)
			{
				prev_w[i] = Malloc(double, total_w_size);
				for(j=0; j<total_w_size; j++)
					prev_w[i][j] = submodel->w[j];
			}
			else if(num_unchanged_w >= 0)
			{
				double norm_w_diff = 0;
				for(j=0; j<total_w_size; j++)
				{
					norm_w_diff += (submodel->w[j] - prev_w[i][j])*(submodel->w[j] - prev_w[i][j]);
					prev_w[i][j] = submodel->w[j];
				}
				norm_w_diff = sqrt(norm_w_diff);

				if(norm_w_diff > 1e-15)
					num_unchanged_w = -1;
			}
			else
			{
				for(j=0; j<total_w_size; j++)
					prev_w[i][j] = submodel->w[j];
			}

			for(j=begin; j<end; j++)
				target[perm[j]] = predict(submodel,prob->x[perm[j]]);

			free_and_destroy_model(&submodel);
		}
		set_print_string_function(default_print_string);

		int total_correct = 0;
		for(i=0; i<prob->l; i++)
			if(target[i] == prob->y[i])
				++total_correct;
		double current_rate = (double)total_correct/prob->l;
		if(current_rate > *best_rate)
		{
			*best_C = param1.C;
			*best_rate = current_rate;
		}

		info("log2c=%7.2f\trate=%g\n",log(param1.C)/log(2.0),100.0*current_rate);
		num_unchanged_w++;
		if(num_unchanged_w == 3)
			break;
		param1.C = param1.C*ratio;
	}

	if(param1.C > max_C && max_C > start_C) 
		info("warning: maximum C reached.\n");
	free(fold_start);
	free(perm);
	free(target);
	for(i=0; i<nr_fold; i++)
	{
		free(subprob[i].x);
		free(subprob[i].y);
		free(prev_w[i]);
	}
	free(prev_w);
	free(subprob);
}